

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeBuilders.cpp
# Opt level: O2

bool __thiscall
Opcode::AABBTreeOfTrianglesBuilder::ComputeGlobalBox
          (AABBTreeOfTrianglesBuilder *this,udword *primitives,udword nb_prims,AABB *global_box)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  udword uVar5;
  MeshInterface *pMVar6;
  IndexedTriangle *pIVar7;
  Point *pPVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Point local_38;
  Point local_28;
  
  if (nb_prims != 0 && primitives != (udword *)0x0) {
    local_28._0_8_ = DAT_001d5fc0._0_8_;
    local_28.z = 3.4028235e+38;
    local_38._0_8_ = DAT_001c72f0;
    pMVar6 = this->mIMesh;
    pIVar7 = pMVar6->mTris;
    pPVar8 = pMVar6->mVerts;
    uVar5 = pMVar6->mVertexStride;
    local_38.z = -3.4028235e+38;
    auVar17 = _DAT_001d5fc0;
    auVar18 = _DAT_001c72f0;
    for (lVar12 = 0; nb_prims != (udword)lVar12; lVar12 = lVar12 + 1) {
      uVar13 = (ulong)(primitives[lVar12] * pMVar6->mTriStride);
      uVar14 = (ulong)(*(int *)((long)pIVar7->mVRef + uVar13) * uVar5);
      uVar15 = (ulong)(*(int *)((long)pIVar7->mVRef + uVar13 + 4) * uVar5);
      uVar13 = (ulong)(*(int *)((long)pIVar7->mVRef + uVar13 + 8) * uVar5);
      fVar1 = *(float *)((long)&pPVar8->z + uVar14);
      if (fVar1 <= local_28.z) {
        local_28.z = fVar1;
      }
      fVar2 = *(float *)((long)&pPVar8->z + uVar15);
      if (fVar2 <= local_28.z) {
        local_28.z = fVar2;
      }
      uVar14 = *(ulong *)((long)&pPVar8->x + uVar14);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar14;
      auVar16 = minps(auVar17,auVar16);
      uVar15 = *(ulong *)((long)&pPVar8->x + uVar15);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar15;
      auVar17 = minps(auVar16,auVar17);
      uVar4 = *(ulong *)((long)&pPVar8->x + uVar13);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar4;
      auVar17 = minps(auVar17,auVar10);
      local_28._0_8_ = auVar17._0_8_;
      fVar3 = *(float *)((long)&pPVar8->z + uVar13);
      if (fVar3 <= local_28.z) {
        local_28.z = fVar3;
      }
      if (local_38.z <= fVar1) {
        local_38.z = fVar1;
      }
      if (local_38.z <= fVar2) {
        local_38.z = fVar2;
      }
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar14;
      auVar16 = maxps(auVar18,auVar9);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar15;
      auVar18 = maxps(auVar16,auVar18);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar4;
      auVar18 = maxps(auVar18,auVar11);
      local_38._0_8_ = auVar18._0_8_;
      if (local_38.z <= fVar3) {
        local_38.z = fVar3;
      }
    }
    IceMaths::AABB::SetMinMax(global_box,&local_28,&local_38);
  }
  return nb_prims != 0 && primitives != (udword *)0x0;
}

Assistant:

bool AABBTreeOfTrianglesBuilder::ComputeGlobalBox(const udword* primitives, udword nb_prims, AABB& global_box) const
{
	// Checkings
	if(!primitives || !nb_prims)	return false;

	// Initialize global box
	Point Min(MAX_FLOAT, MAX_FLOAT, MAX_FLOAT);
	Point Max(MIN_FLOAT, MIN_FLOAT, MIN_FLOAT);

	// Loop through triangles
	VertexPointers VP;
	while(nb_prims--)
	{
		// Get current triangle-vertices
		mIMesh->GetTriangle(VP, *primitives++);
		// Update global box
		Min.Min(*VP.Vertex[0]).Min(*VP.Vertex[1]).Min(*VP.Vertex[2]);
		Max.Max(*VP.Vertex[0]).Max(*VP.Vertex[1]).Max(*VP.Vertex[2]);
	}
	global_box.SetMinMax(Min, Max);
	return true;
}